

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_budget(envy_bios *bios)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  size_t __size;
  uint uVar3;
  envy_bios_power_budget_entry *peVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  
  uVar7 = (bios->power).budget.offset;
  if ((ulong)uVar7 == 0) {
    return -0x16;
  }
  if (uVar7 < bios->length) {
    (bios->power).budget.version = bios->data[uVar7];
  }
  else {
    (bios->power).budget.version = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
  }
  uVar12 = (ulong)(bios->power).budget.version;
  if ((0x30 < uVar12) || ((0x1000100010000U >> (uVar12 & 0x3f) & 1) == 0)) {
    fprintf(_stderr,"Unknown POWER BUDGET table version 0x%x\n");
    return -0x16;
  }
  uVar7 = (bios->power).budget.offset + 1;
  if (uVar7 < bios->length) {
    (bios->power).budget.hlen = bios->data[uVar7];
    iVar13 = 0;
  }
  else {
    (bios->power).budget.hlen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar13 = -0xe;
  }
  uVar7 = (bios->power).budget.offset + 2;
  if (uVar7 < bios->length) {
    (bios->power).budget.rlen = bios->data[uVar7];
    iVar5 = 0;
  }
  else {
    (bios->power).budget.rlen = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar5 = -0xe;
  }
  uVar7 = (bios->power).budget.offset + 3;
  if (uVar7 < bios->length) {
    (bios->power).budget.entriesnum = bios->data[uVar7];
    iVar10 = 0;
  }
  else {
    (bios->power).budget.entriesnum = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    iVar10 = -0xe;
  }
  (bios->power).budget.valid = (iVar5 == 0 && iVar13 == 0) && iVar10 == 0;
  uVar1 = (bios->power).budget.version;
  if (uVar1 == ' ') {
    uVar7 = (bios->power).budget.offset + 9;
  }
  else {
    if (uVar1 != '0') goto LAB_0025e523;
    uVar7 = (bios->power).budget.offset + 10;
  }
  if (uVar7 < bios->length) {
    (bios->power).budget.cap_entry = bios->data[uVar7];
  }
  else {
    (bios->power).budget.cap_entry = '\0';
    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
  }
LAB_0025e523:
  __size = (ulong)(bios->power).budget.entriesnum * 0x18;
  peVar4 = (envy_bios_power_budget_entry *)malloc(__size);
  (bios->power).budget.entries = peVar4;
  memset(peVar4,0,__size);
  if ((bios->power).budget.entriesnum != '\0') {
    lVar11 = 0;
    uVar12 = 0;
    uVar7 = 0;
    do {
      iVar5 = (uint)(bios->power).budget.hlen + (bios->power).budget.offset;
      uVar9 = (uint)(bios->power).budget.rlen;
      iVar10 = (int)uVar12 * uVar9;
      iVar13 = iVar5 + iVar10;
      peVar4 = (bios->power).budget.entries;
      *(int *)((long)&peVar4->offset + lVar11) = iVar13;
      uVar8 = iVar10 + iVar5 + 2;
      uVar6 = iVar5 + iVar10 + 5;
      if (uVar9 == 6) {
        if (uVar6 < bios->length) {
          puVar2 = bios->data;
          *(uint *)((long)&peVar4->avg + lVar11) =
               CONCAT13(puVar2[uVar6],
                        CONCAT12(puVar2[iVar13 + 4],CONCAT11(puVar2[iVar13 + 3],puVar2[uVar8])));
          uVar6 = 0;
        }
        else {
          *(undefined4 *)((long)&peVar4->avg + lVar11) = 0;
          fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
          uVar6 = 0xfffffff2;
        }
      }
      else {
        if (uVar6 < bios->length) {
          puVar2 = bios->data;
          *(uint *)((long)&peVar4->min + lVar11) =
               CONCAT13(puVar2[uVar6],
                        CONCAT12(puVar2[iVar13 + 4],CONCAT11(puVar2[iVar13 + 3],puVar2[uVar8])));
          uVar6 = 0;
        }
        else {
          *(undefined4 *)((long)&peVar4->min + lVar11) = 0;
          fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
          uVar6 = 0xfffffff2;
        }
        peVar4 = (bios->power).budget.entries;
        if (iVar13 + 9U < bios->length) {
          puVar2 = bios->data;
          *(uint *)((long)&peVar4->avg + lVar11) =
               CONCAT13(puVar2[iVar13 + 9U],
                        CONCAT12(puVar2[iVar13 + 8],CONCAT11(puVar2[iVar13 + 7],puVar2[iVar13 + 6]))
                       );
          uVar8 = 0;
        }
        else {
          *(undefined4 *)((long)&peVar4->avg + lVar11) = 0;
          fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
          uVar8 = 0xfffffff2;
        }
        peVar4 = (bios->power).budget.entries;
        if (iVar13 + 0xdU < bios->length) {
          puVar2 = bios->data;
          *(uint *)((long)&peVar4->peak + lVar11) =
               CONCAT13(puVar2[iVar13 + 0xdU],
                        CONCAT12(puVar2[iVar13 + 0xc],
                                 CONCAT11(puVar2[iVar13 + 0xb],puVar2[iVar13 + 10])));
          uVar9 = 0;
        }
        else {
          *(undefined4 *)((long)&peVar4->peak + lVar11) = 0;
          fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
          uVar9 = 0xfffffff2;
        }
        peVar4 = (bios->power).budget.entries;
        if (iVar13 + 0x15U < bios->length) {
          puVar2 = bios->data;
          *(uint *)((long)&peVar4->unkn12 + lVar11) =
               CONCAT13(puVar2[iVar13 + 0x15U],
                        CONCAT12(puVar2[iVar13 + 0x14],
                                 CONCAT11(puVar2[iVar13 + 0x13],puVar2[iVar13 + 0x12])));
          uVar3 = 0;
        }
        else {
          *(undefined4 *)((long)&peVar4->unkn12 + lVar11) = 0;
          fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
          uVar3 = 0xfffffff2;
        }
        uVar6 = uVar6 | uVar8 | uVar9 | uVar3;
      }
      uVar7 = uVar7 | uVar6;
      (&((bios->power).budget.entries)->valid)[lVar11] = uVar7 == 0;
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x18;
    } while (uVar12 < (bios->power).budget.entriesnum);
  }
  return 0;
}

Assistant:

int envy_bios_parse_power_budget(struct envy_bios *bios) {
	struct envy_bios_power_budget *budget = &bios->power.budget;
	int i, err = 0;

	if (!budget->offset)
		return -EINVAL;

	bios_u8(bios, budget->offset + 0x0, &budget->version);

	switch(budget->version) {
	case 0x10:
	case 0x20:
	case 0x30:
		err |= bios_u8(bios, budget->offset + 0x1, &budget->hlen);
		err |= bios_u8(bios, budget->offset + 0x2, &budget->rlen);
		err |= bios_u8(bios, budget->offset + 0x3, &budget->entriesnum);
		budget->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown POWER BUDGET table version 0x%x\n", budget->version);
		return -EINVAL;
	};

	switch(budget->version) {
	case 0x20:
		err |= bios_u8(bios, budget->offset + 0x9, &budget->cap_entry);
		break;
	case 0x30:
		err |= bios_u8(bios, budget->offset + 0xa, &budget->cap_entry);
		break;
	};

	err = 0;
	budget->entries = malloc(budget->entriesnum * sizeof(struct envy_bios_power_budget_entry));
	memset(budget->entries, 0x0, budget->entriesnum * sizeof(struct envy_bios_power_budget_entry));
	for (i = 0; i < budget->entriesnum; i++) {
		uint32_t data = budget->offset + budget->hlen + i * budget->rlen;

		budget->entries[i].offset = data;

		if (budget->rlen == 0x6) {
			err |= bios_u32(bios, data + 0x02, &budget->entries[i].avg);
		} else {
			err |= bios_u32(bios, data + 0x02, &budget->entries[i].min);
			err |= bios_u32(bios, data + 0x06, &budget->entries[i].avg);
			err |= bios_u32(bios, data + 0x0a, &budget->entries[i].peak);
			err |= bios_u32(bios, data + 0x12, &budget->entries[i].unkn12);
		}

		budget->entries[i].valid = !err;
	}

	return 0;
}